

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O1

unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> __thiscall
duckdb::StandardBufferManager::ReadTemporaryBuffer
          (StandardBufferManager *this,MemoryTag tag,BlockHandle *block,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
          *reusable_buffer)

{
  unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> reusable_buffer_00;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var1;
  bool bVar2;
  pointer pTVar3;
  type pTVar4;
  FileSystem *pFVar5;
  pointer this_01;
  type handle_00;
  pointer *__ptr;
  undefined7 in_register_00000031;
  StandardBufferManager *this_02;
  long *in_R8;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> handle;
  idx_t block_size;
  string path;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_70;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_68;
  long *local_60;
  idx_t local_58;
  string local_50;
  
  this_02 = (StandardBufferManager *)CONCAT71(in_register_00000031,tag);
  reusable_buffer_00._M_head_impl =
       reusable_buffer[9].
       super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
       super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
  this_00 = &(this_02->temporary_directory).handle;
  pTVar3 = unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
           ::operator->(this_00);
  pTVar4 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
           ::operator*(&pTVar3->temp_file);
  bVar2 = TemporaryFileManager::HasTemporaryBuffer
                    (pTVar4,(block_id_t)reusable_buffer_00._M_head_impl);
  if (bVar2) {
    pTVar3 = unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
             ::operator->(this_00);
    pTVar4 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
             ::operator*(&pTVar3->temp_file);
    local_60 = (long *)*in_R8;
    *in_R8 = 0;
    TemporaryFileManager::ReadTemporaryBuffer
              ((TemporaryFileManager *)this,(block_id_t)pTVar4,
               (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
               reusable_buffer_00._M_head_impl);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
  }
  else {
    GetTemporaryPath_abi_cxx11_(&local_50,this_02,(block_id_t)reusable_buffer_00._M_head_impl);
    pFVar5 = FileSystem::GetFileSystem(this_02->db);
    (*pFVar5->_vptr_FileSystem[2])(&local_70,pFVar5,&local_50,1,0x100,0);
    this_01 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
              operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                          *)&local_70);
    FileHandle::Read(this_01,&local_58,8,0);
    handle_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
                operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                           *)&local_70);
    local_68._M_head_impl = (FileBuffer *)*in_R8;
    *in_R8 = 0;
    ReadTemporaryBufferInternal
              (this,(BufferManager *)this_02,handle_00,8,local_58,
               (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
               &local_68);
    if (local_68._M_head_impl != (FileBuffer *)0x0) {
      (*(local_68._M_head_impl)->_vptr_FileBuffer[1])();
    }
    _Var1._M_head_impl = local_70._M_head_impl;
    local_68._M_head_impl = (FileBuffer *)0x0;
    local_70._M_head_impl = (FileHandle *)0x0;
    if (_Var1._M_head_impl != (FileHandle *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_FileHandle[1])();
    }
    DeleteTemporaryFile(this_02,(BlockHandle *)reusable_buffer);
    if (local_70._M_head_impl != (FileHandle *)0x0) {
      (*(local_70._M_head_impl)->_vptr_FileHandle[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)
         (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)this;
}

Assistant:

unique_ptr<FileBuffer> StandardBufferManager::ReadTemporaryBuffer(MemoryTag tag, BlockHandle &block,
                                                                  unique_ptr<FileBuffer> reusable_buffer) {
	D_ASSERT(!temporary_directory.path.empty());
	D_ASSERT(temporary_directory.handle.get());
	auto id = block.BlockId();
	if (temporary_directory.handle->GetTempFile().HasTemporaryBuffer(id)) {
		// This is a block that was offloaded to a regular .tmp file, the file contains blocks of a fixed size
		return temporary_directory.handle->GetTempFile().ReadTemporaryBuffer(id, std::move(reusable_buffer));
	}

	// This block contains data of variable size so we need to open it and read it to get its size.
	idx_t block_size;
	auto path = GetTemporaryPath(id);
	auto &fs = FileSystem::GetFileSystem(db);
	auto handle = fs.OpenFile(path, FileFlags::FILE_FLAGS_READ);
	handle->Read(&block_size, sizeof(idx_t), 0);

	// Allocate a buffer of the file's size and read the data into that buffer.
	auto buffer = ReadTemporaryBufferInternal(*this, *handle, sizeof(idx_t), block_size, std::move(reusable_buffer));
	handle.reset();

	// Delete the file and return the buffer.
	DeleteTemporaryFile(block);
	return buffer;
}